

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTestHBD_d16_RandomValues_Test::
~BlendA64MaskTestHBD_d16_RandomValues_Test(BlendA64MaskTestHBD_d16_RandomValues_Test *this)

{
  void *in_RDI;
  
  ~BlendA64MaskTestHBD_d16_RandomValues_Test((BlendA64MaskTestHBD_d16_RandomValues_Test *)0xa90568);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD_d16, RandomValues) {
  if (params_.tst_func == nullptr) return;
  for (bit_depth_ = 8; bit_depth_ <= 12 && !HasFatalFailure();
       bit_depth_ += 2) {
    src_max_bits_mask_ =
        (bit_depth_ == 8) ? kSrcMaxBitsMask : kSrcMaxBitsMaskHBD;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure();
         ++bsize) {
      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_.Rand8();
        dst_tst_[i] = rng_.Rand8();

        src0_[i] = rng_.Rand16() & src_max_bits_mask_;
        src1_[i] = rng_.Rand16() & src_max_bits_mask_;
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      RunTest(bsize, 1);
    }
  }
}